

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O0

void Ga2_ManRefinePrint(Ga2_Man_t *p,Vec_Int_t *vVec)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  bool bVar4;
  Vec_Int_t *vLeaves;
  int k;
  int i;
  Gia_Obj_t *pFanin;
  Gia_Obj_t *pObj;
  Vec_Int_t *vVec_local;
  Ga2_Man_t *p_local;
  
  printf("\n         Unsat core: \n");
  vLeaves._4_4_ = 0;
  while( true ) {
    iVar2 = Vec_IntSize(vVec);
    bVar4 = false;
    if ((int)vLeaves._4_4_ < iVar2) {
      pGVar1 = p->pGia;
      iVar2 = Vec_IntEntry(vVec,vLeaves._4_4_);
      pFanin = Gia_ManObj(pGVar1,iVar2);
      bVar4 = pFanin != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    p_00 = Ga2_ObjLeaves(p->pGia,pFanin);
    printf("%12d : ",(ulong)vLeaves._4_4_);
    uVar3 = Gia_ObjId(p->pGia,pFanin);
    printf("Obj =%6d ",(ulong)uVar3);
    iVar2 = Gia_ObjIsRo(p->pGia,pFanin);
    if (iVar2 == 0) {
      printf("   ");
    }
    else {
      printf("ff ");
    }
    iVar2 = Ga2_ObjIsAbs0(p,pFanin);
    if (iVar2 == 0) {
      iVar2 = Ga2_ObjIsLeaf0(p,pFanin);
      if (iVar2 == 0) {
        printf("  ");
      }
      else {
        printf("l ");
      }
    }
    else {
      printf("a ");
    }
    printf("Fanins: ");
    vLeaves._0_4_ = 0;
    while( true ) {
      iVar2 = Vec_IntSize(p_00);
      bVar4 = false;
      if ((int)vLeaves < iVar2) {
        pGVar1 = p->pGia;
        iVar2 = Vec_IntEntry(p_00,(int)vLeaves);
        _k = Gia_ManObj(pGVar1,iVar2);
        bVar4 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      uVar3 = Gia_ObjId(p->pGia,_k);
      printf("%6d ",(ulong)uVar3);
      iVar2 = Gia_ObjIsRo(p->pGia,_k);
      if (iVar2 == 0) {
        printf("   ");
      }
      else {
        printf("ff ");
      }
      iVar2 = Ga2_ObjIsAbs0(p,_k);
      if (iVar2 == 0) {
        iVar2 = Ga2_ObjIsLeaf0(p,_k);
        if (iVar2 == 0) {
          printf("  ");
        }
        else {
          printf("l ");
        }
      }
      else {
        printf("a ");
      }
      vLeaves._0_4_ = (int)vLeaves + 1;
    }
    printf("\n");
    vLeaves._4_4_ = vLeaves._4_4_ + 1;
  }
  return;
}

Assistant:

void Ga2_ManRefinePrint( Ga2_Man_t * p, Vec_Int_t * vVec )
{
    Gia_Obj_t * pObj, * pFanin;
    int i, k;
    printf( "\n         Unsat core: \n" );
    Gia_ManForEachObjVec( vVec, p->pGia, pObj, i )
    {
        Vec_Int_t * vLeaves = Ga2_ObjLeaves( p->pGia, pObj );
        printf( "%12d : ", i );
        printf( "Obj =%6d ", Gia_ObjId(p->pGia, pObj) );
        if ( Gia_ObjIsRo(p->pGia, pObj) )
            printf( "ff " );
        else
            printf( "   " );
        if ( Ga2_ObjIsAbs0(p, pObj) )
            printf( "a " );
        else if ( Ga2_ObjIsLeaf0(p, pObj) )
            printf( "l " );
        else 
            printf( "  " );
        printf( "Fanins: " );
        Gia_ManForEachObjVec( vLeaves, p->pGia, pFanin, k )
        {
            printf( "%6d ", Gia_ObjId(p->pGia, pFanin) );
            if ( Gia_ObjIsRo(p->pGia, pFanin) )
                printf( "ff " );
            else
                printf( "   " );
            if ( Ga2_ObjIsAbs0(p, pFanin) )
                printf( "a " );
            else if ( Ga2_ObjIsLeaf0(p, pFanin) )
                printf( "l " );
            else
                printf( "  " );
        }
        printf( "\n" );
    }
}